

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

StructurePtr __thiscall soul::heart::Parser::findStruct(Parser *this,string *name)

{
  bool bVar1;
  __type_conflict1 _Var2;
  Module *pMVar3;
  char *pcVar4;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this_00;
  Structure *s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string_view name_00;
  string local_b8;
  RefCountedPtr<soul::Structure> *local_98;
  RefCountedPtr<soul::Structure> *s_1;
  RefCountedPtr<soul::Structure> *__end3;
  RefCountedPtr<soul::Structure> *__begin3;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> *local_70;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> *__range3;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  string *name_local;
  Parser *this_local;
  StructurePtr *s;
  
  pMVar3 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)&name[4]._M_string_length);
  pcVar4 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view((string *)in_RDX);
  name_00._M_str = pcVar4;
  name_00._M_len = (size_t)&pMVar3->structs;
  Module::Structs::find((Structs *)this,name_00);
  bVar1 = RefCountedPtr::operator_cast_to_bool((RefCountedPtr *)this);
  if (!bVar1) {
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)this);
    this_00 = Program::getModules((Program *)((long)&name[3].field_2 + 8));
    __end2 = std::
             vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
             begin(this_00);
    m = (pool_ref<soul::Module> *)
        std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
        end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                       *)&m), bVar1) {
      __range3 = (ArrayView<soul::RefCountedPtr<soul::Structure>_> *)
                 __gnu_cxx::
                 __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                 ::operator*(&__end2);
      pMVar3 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range3);
      ___begin3 = Module::Structs::get(&pMVar3->structs);
      local_70 = (ArrayView<soul::RefCountedPtr<soul::Structure>_> *)&__begin3;
      __end3 = ArrayView<soul::RefCountedPtr<soul::Structure>_>::begin(local_70);
      s_1 = ArrayView<soul::RefCountedPtr<soul::Structure>_>::end(local_70);
      for (; __end3 != s_1; __end3 = __end3 + 1) {
        local_98 = __end3;
        s_00 = RefCountedPtr<soul::Structure>::operator*(__end3);
        Program::getFullyQualifiedStructName_abi_cxx11_
                  (&local_b8,(Program *)((long)&name[3].field_2 + 8),s_00);
        _Var2 = std::operator==(&local_b8,in_RDX);
        std::__cxx11::string::~string((string *)&local_b8);
        if (_Var2) {
          RefCountedPtr<soul::Structure>::RefCountedPtr
                    ((RefCountedPtr<soul::Structure> *)this,local_98);
          return (StructurePtr)(Structure *)this;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
      ::operator++(&__end2);
    }
    memset(this,0,8);
    RefCountedPtr<soul::Structure>::RefCountedPtr((RefCountedPtr<soul::Structure> *)this);
  }
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr findStruct (const std::string& name)
    {
        if (auto s = module->structs.find (name))
            return s;

        for (auto& m : program.getModules())
            for (auto& s : m->structs.get())
                if (program.getFullyQualifiedStructName (*s) == name)
                    return s;

        return {};
    }